

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  size_t sVar1;
  size_t sVar2;
  undefined4 in_ECX;
  int iVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar4._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar4._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar4._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar3 = movmskps(in_ECX,auVar4);
  sVar1 = 0xffffffffffffffd6;
  if ((((iVar3 == 0xf) && (params.cParams.minMatch - 3 < 5)) &&
      (params.cParams.targetLength < 0x20001)) &&
     ((params.cParams.strategy - ZSTD_fast < 9 &&
      (sVar1 = 0xffffffffffffffc4, cctx->streamStage == zcss_init)))) {
    (cctx->requestedParams).fParams.contentSizeFlag = (uint)(params.fParams.contentSizeFlag != 0);
    (cctx->requestedParams).fParams.checksumFlag = (uint)((ulong)params.fParams._0_8_ >> 0x20 != 0);
    (cctx->requestedParams).fParams.noDictIDFlag = (uint)(params.fParams.noDictIDFlag != 0);
    sVar2 = ZSTD_CCtx_setCParams(cctx,params.cParams);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}